

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedEventLoop.cpp
# Opt level: O3

void __thiscall
Storage::TimedEventLoop::set_next_event_time_interval(TimedEventLoop *this,float interval)

{
  float fVar1;
  
  fVar1 = interval * (float)this->input_clock_rate_ + this->subcycles_until_event_;
  this->cycles_until_event_ = this->cycles_until_event_ + (long)fVar1;
  fVar1 = fmodf(fVar1,1.0);
  this->subcycles_until_event_ = fVar1;
  if (this->cycles_until_event_ < 0) {
    __assert_fail("cycles_until_event_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/TimedEventLoop.cpp"
                  ,0x50,"void Storage::TimedEventLoop::set_next_event_time_interval(float)");
  }
  if (0.0 <= fVar1) {
    return;
  }
  __assert_fail("subcycles_until_event_ >= 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/TimedEventLoop.cpp"
                ,0x51,"void Storage::TimedEventLoop::set_next_event_time_interval(float)");
}

Assistant:

void TimedEventLoop::set_next_event_time_interval(float interval) {
	// Calculate [interval]*[input clock rate] + [subcycles until this event]
	const float float_interval = interval * float(input_clock_rate_) + subcycles_until_event_;

	// This event will fire in the integral number of cycles from now, putting us at the remainder
	// number of subcycles.
	const Cycles::IntType addition = Cycles::IntType(float_interval);
	cycles_until_event_ += addition;
	subcycles_until_event_ = fmodf(float_interval, 1.0f);

	assert(cycles_until_event_ >= 0);
	assert(subcycles_until_event_ >= 0.0f);
}